

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

string * expect_eval_exception_abi_cxx11_(string *__return_storage_ptr__,wstring_view *text)

{
  undefined8 s;
  wostream *pwVar1;
  interpreter i;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  gc_heap h;
  value local_50;
  
  i.impl_._M_t.
  super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>._M_t.
  super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>.
  super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl._0_4_ = tested_version_;
  std::
  make_shared<mjs::source_file,wchar_t_const(&)[5],std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,mjs::version>
            ((wchar_t (*) [5])&h,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)L"test",
             (version *)text);
  mjs::parse((mjs *)local_e8._M_pod_data,(shared_ptr<mjs::source_file> *)&h,non_strict);
  s = local_e8._M_unused._0_8_;
  local_e8._M_unused._M_object = (void *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&h.pointers_.capacity_);
  mjs::gc_heap::gc_heap(&h,0x100000);
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  mjs::interpreter::interpreter(&i,&h,tested_version_,(on_statement_executed_type *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  mjs::interpreter::eval(&local_50,&i,(statement *)s);
  mjs::value::~value(&local_50);
  mjs::interpreter::~interpreter(&i);
  mjs::gc_heap::~gc_heap(&h);
  pwVar1 = std::operator<<((wostream *)&std::wcout,"Exception not thrown in\n");
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,text->_M_str,text->_M_len);
  std::operator<<(pwVar1,"\n");
  h.pointers_.set_ = (gc_heap_ptr_untyped **)0x1d;
  h.pointers_._8_8_ = anon_var_dwarf_1ed2e;
  mjs::throw_runtime_error
            ((string_view *)&h,
             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x77);
}

Assistant:

std::string expect_eval_exception(const std::wstring_view& text) {
    decltype(parse(nullptr)) bs;
    try {
        bs = parse(std::make_shared<source_file>(L"test", text, tested_version()));
    } catch (const std::exception& e) {
        std::wcout << "Parse failed for \"" << text << "\": " << e.what() <<  "\n";
        throw;
    }

    try {
        gc_heap h{1<<20}; // Use local heap, even if expected lives in another heap
        interpreter i{h, tested_version()};
        (void) i.eval(*bs);
    } catch (const eval_exception& e) {
        return e.what();
    } catch (const std::exception& e) {
        std::wcout << "Unexpected exception thrown: " << e.what() << " while processing\n" << text << "\n"; 
        throw;
    }

    std::wcout << "Exception not thrown in\n" << text << "\n";
    THROW_RUNTIME_ERROR("Expected exception not thrown");
}